

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

NULLCRef * NULLCVector::VectorNext(NULLCRef *__return_storage_ptr__,vector_iterator *iter)

{
  char *local_30;
  uint local_24;
  vector_iterator *iter_local;
  
  if (iter->arr->flags == 0) {
    local_24 = iter->arr->elemType;
  }
  else {
    local_24 = nullcGetSubType(iter->arr->elemType);
  }
  __return_storage_ptr__->typeID = local_24;
  if (iter->arr->flags == 0) {
    local_30 = (iter->arr->data).ptr + iter->arr->elemSize * iter->pos;
  }
  else {
    local_30 = *(char **)((iter->arr->data).ptr + (ulong)iter->pos * 8);
  }
  __return_storage_ptr__->ptr = local_30;
  iter->pos = iter->pos + 1;
  return __return_storage_ptr__;
}

Assistant:

NULLCRef VectorNext(vector_iterator* iter)
	{
		NULLCRef ret;
		ret.typeID = (iter->arr->flags ? nullcGetSubType(iter->arr->elemType) : iter->arr->elemType);
		ret.ptr =  iter->arr->flags ? ((char**)iter->arr->data.ptr)[iter->pos] : iter->arr->data.ptr + iter->arr->elemSize * iter->pos;
		iter->pos++;
		return ret;
	}